

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
__thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder *this)

{
  ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Tuple_impl<0UL,_testing::internal::ValueArray<const_libaom_test::CodecFactory_*>,_testing::internal::ValueArray<libaom_test::TestMode>,_testing::internal::ValueArray<int>,_testing::internal::ValueArray<int>_>
  *in_RSI;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
  PVar2;
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
  local_60;
  
  __p = (ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
         *)operator_new(0x48);
  std::
  _Tuple_impl<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>>
  ::
  _Tuple_impl<testing::internal::ValueArray<libaom_test::CodecFactory_const*>,testing::internal::ValueArray<libaom_test::TestMode>,testing::internal::ValueArray<int>,testing::internal::ValueArray<int>>
            ((_Tuple_impl<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<int>>
              *)&local_60,in_RSI);
  __p->_vptr_ParamGeneratorInterface = (_func_int **)&PTR__CartesianProductGenerator_0106d3d8;
  std::
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
                 *)(__p + 1),&local_60);
  *(ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
    **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::internal::ParamGeneratorInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int>>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  _Var1._M_pi = extraout_RDX;
  if (local_60.
      super__Head_base<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_false>
      ._M_head_impl.impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super__Head_base<0UL,_testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_false>
               ._M_head_impl.impl_.
               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_libaom_test::CodecFactory_*>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_60.
      super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
      .super__Head_base<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_false>.
      _M_head_impl.impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::TestMode>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
               .
               super__Head_base<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_false>
               ._M_head_impl.impl_.
               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::TestMode>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  if (local_60.
      super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
      .
      super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
      .super__Head_base<2UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
               .
               super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
               .super__Head_base<2UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.
               impl_.
               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_02;
  }
  if (local_60.
      super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
      .
      super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
      .super__Tuple_impl<3UL,_testing::internal::ParamGenerator<int>_>.
      super__Head_base<3UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super__Tuple_impl<1UL,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
               .
               super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<int>_>
               .super__Tuple_impl<3UL,_testing::internal::ParamGenerator<int>_>.
               super__Head_base<3UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.
               impl_.
               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_03;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>
          )PVar2.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }